

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

double __thiscall gmath::OrthoCamera::projectPoint(OrthoCamera *this,Vector2d *p,Vector3d *Pw)

{
  int i_1;
  Matrix33d *pMVar1;
  undefined8 *puVar2;
  int k_1;
  int k;
  long lVar3;
  Matrix33d *pMVar4;
  int i;
  long lVar5;
  double dVar6;
  double dStack_88;
  Vector3d Pc;
  double dStack_68;
  SVector<double,_3> ret_1;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined8 local_8;
  
  pMVar1 = &(this->super_Camera).R;
  puVar2 = &local_48;
  local_30 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_10 = 0;
  local_48 = 0x3ff0000000000000;
  uStack_28 = 0x3ff0000000000000;
  local_8 = 0x3ff0000000000000;
  lVar3 = 0;
  do {
    lVar5 = 0;
    pMVar4 = pMVar1;
    do {
      puVar2[lVar5] = pMVar4->v[0][0];
      lVar5 = lVar5 + 1;
      pMVar4 = (Matrix33d *)(pMVar4->v + 1);
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 3;
    pMVar1 = (Matrix33d *)(pMVar1->v[0] + 1);
  } while (lVar3 != 3);
  ret_1.v[0] = 0.0;
  ret_1.v[1] = 0.0;
  lVar3 = 0;
  do {
    ret_1.v[lVar3 + -1] = Pw->v[lVar3] - (this->super_Camera).T.v[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  Pc.v[0] = 0.0;
  Pc.v[1] = 0.0;
  puVar2 = &local_48;
  lVar3 = 0;
  do {
    dVar6 = Pc.v[lVar3 + -1];
    lVar5 = 0;
    do {
      dVar6 = dVar6 + (double)puVar2[lVar5] * ret_1.v[lVar5 + -1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    Pc.v[lVar3 + -1] = dVar6;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 3;
  } while (lVar3 != 3);
  *(double *)p = 0.0 / this->res;
  *(double *)(p + 8) = -Pc.v[0] / this->res;
  return Pc.v[1] / this->dres;
}

Assistant:

double OrthoCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  Vector3d Pc=transpose(getR())*(Pw-getT());

  p[0]=Pc[0]/res;
  p[1]=-Pc[1]/res;

  return Pc[2]/dres;
}